

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QString.cpp
# Opt level: O0

QToken * QToken::wildcard(void)

{
  QToken *in_RDI;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  QToken *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int local_30;
  size_type in_stack_ffffffffffffffd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0;
  this = in_RDI;
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x209bd5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->opts_,(value_type_conflict2 *)in_stack_ffffffffffffffa8);
  }
  QToken(this,in_stack_ffffffffffffffa8);
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

QToken QToken::wildcard() {
    std::vector<uint8_t> options;
    options.reserve(256);
    for (int i = 0; i < 256; i++) {
        options.push_back(static_cast<uint8_t>(i));
    }
    return QToken(std::move(options));
}